

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

pair<const_llvm::ConstantInt_*,_dg::vr::Relations> __thiscall
dg::vr::ValueRelations::getBound(ValueRelations *this,Handle h,Relations rels)

{
  _Rb_tree_header *p_Var1;
  _Base_bitset<1UL> _Var2;
  C lt;
  Relations RVar3;
  _Base_ptr p_Var4;
  C rt;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar5;
  RelationsMap related;
  _Base_bitset<1UL> local_70;
  _Base_bitset<1UL> local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  local_68._M_w = (_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_60,&this->graph,h,(Relations *)&local_68,false);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    local_70._M_w = 0;
    rt = (C)0x0;
  }
  else {
    rt = (C)0x0;
    local_70._M_w = 0;
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lt = getAnyConst(this,*(Handle *)(p_Var4 + 1));
      _Var2._M_w = local_68._M_w;
      if ((lt != (C)0x0) &&
         ((rt == (C)0x0 ||
          (RVar3 = compare(lt,rt),
          ((ulong)RVar3.bits.super__Base_bitset<1UL>._M_w & _Var2._M_w) != 0)))) {
        local_70._M_w = (_WordT)p_Var4[1]._M_parent;
        rt = lt;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  pVar5.second.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(bitset<12UL>)local_70._M_w;
  pVar5.first = rt;
  return pVar5;
}

Assistant:

std::pair<ValueRelations::C, Relations>
ValueRelations::getBound(Handle h, Relations rels) const {
    RelationsMap related = graph.getRelated(h, rels);

    C resultC = nullptr;
    Relations resultR;
    for (const auto &pair : related) {
        C c = getAnyConst(pair.first);
        if (c && (!resultC || compare(c, rels, resultC))) {
            resultC = c;
            resultR = pair.second;
        }
    }

    return {resultC, resultR};
}